

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O3

filepos_t MATROSKA_CuePosInSegment(matroska_cuepoint *Cue)

{
  ebml_context *peVar1;
  bool_t bVar2;
  ebml_master *Element;
  ebml_integer *Element_00;
  int64_t iVar3;
  
  peVar1 = MATROSKA_getContextCuePoint();
  bVar2 = EBML_ElementIsType((ebml_element *)Cue,peVar1);
  if (bVar2 == 0) {
    __assert_fail("EBML_ElementIsType((ebml_element*)Cue, MATROSKA_getContextCuePoint())",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x328,"filepos_t MATROSKA_CuePosInSegment(const matroska_cuepoint *)");
  }
  peVar1 = MATROSKA_getContextCueTrackPositions();
  Element = (ebml_master *)EBML_MasterFindFirstElt(&Cue->Base,peVar1,0,0,0);
  if (Element != (ebml_master *)0x0) {
    peVar1 = MATROSKA_getContextCueClusterPosition();
    Element_00 = (ebml_integer *)EBML_MasterFindFirstElt(Element,peVar1,0,0,0);
    if (Element_00 != (ebml_integer *)0x0) {
      iVar3 = EBML_IntegerValue(Element_00);
      return iVar3;
    }
  }
  return 0x7fffffffffffffff;
}

Assistant:

filepos_t MATROSKA_CuePosInSegment(const matroska_cuepoint *Cue)
{
    ebml_element *Timestamp;
    assert(EBML_ElementIsType((ebml_element*)Cue, MATROSKA_getContextCuePoint()));
    Timestamp = EBML_MasterFindChild((ebml_master*)Cue,MATROSKA_getContextCueTrackPositions());
    if (!Timestamp)
        return INVALID_TIMESTAMP_T;
    Timestamp = EBML_MasterFindChild((ebml_master*)Timestamp,MATROSKA_getContextCueClusterPosition());
    if (!Timestamp)
        return INVALID_TIMESTAMP_T;
    return EBML_IntegerValue((ebml_integer*)Timestamp);
}